

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O1

void __thiscall Date::setTime(Date *this,time_t time,Mode mode)

{
  int iVar1;
  long *plVar2;
  undefined8 *puVar3;
  tm *ptVar4;
  tm ltime;
  undefined1 local_61;
  long local_60;
  undefined1 *local_58 [5];
  long local_30;
  
  local_58[0] = &local_61;
  local_60 = time;
  plVar2 = (long *)__tls_get_addr(&PTR_00191bf8);
  *plVar2 = (long)local_58;
  puVar3 = (undefined8 *)__tls_get_addr(&PTR_00191d60);
  *puVar3 = std::once_flag::_Prepare_execution::
            _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
            ::anon_class_1_0_00000001::__invoke;
  iVar1 = pthread_once(&tzFlag._M_once,__once_proxy);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  *plVar2 = 0;
  *puVar3 = 0;
  if (mode != UTC) {
    ptVar4 = localtime_r(&local_60,(tm *)local_58);
    if (ptVar4 == (tm *)0x0) {
      return;
    }
    local_60 = local_30 + local_60;
  }
  this->mTime = local_60;
  return;
}

Assistant:

void Date::setTime(time_t time, Mode mode)
{
    std::call_once(tzFlag, []() {
            tzset();
        });
    if (mode == UTC) {
        mTime = time;
    } else {
        struct tm ltime;
        if (modetime(time, &ltime, mode)) {
#ifdef _WIN32
            long tz = 0;

            // The following does NOT work because of linker errors:
            // _get_timezone(&tz);
            // user GetTimeZoneInformation() instead:
            TIME_ZONE_INFORMATION inf;
            GetTimeZoneInformation(&inf);
            tz = inf.Bias;

            mTime = time + tz;

#else
            mTime = time + ltime.tm_gmtoff;
#endif
        }
    }
}